

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O0

FixedFieldInfo * __thiscall IR::Instr::GetFixedFunction(Instr *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  AddrOpnd *pAVar4;
  FixedFieldInfo *function;
  Instr *this_local;
  
  bVar2 = HasFixedFunctionAddressTarget(this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0xe03,"(HasFixedFunctionAddressTarget())","HasFixedFunctionAddressTarget()")
    ;
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  pAVar4 = Opnd::AsAddrOpnd(this->m_src1);
  return (FixedFieldInfo *)pAVar4->m_metadata;
}

Assistant:

FixedFieldInfo* Instr::GetFixedFunction() const
{
    Assert(HasFixedFunctionAddressTarget());
    FixedFieldInfo* function = (FixedFieldInfo*)this->m_src1->AsAddrOpnd()->m_metadata;
    return function;
}